

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV1SceneBlock(Parser *this)

{
  bool bVar1;
  int local_14;
  int iDepth;
  Parser *this_local;
  
  local_14 = 0;
  do {
    while (*this->filePtr != '*') {
      if (*this->filePtr == '{') {
        local_14 = local_14 + 1;
      }
      else if (*this->filePtr == '}') {
        local_14 = local_14 + -1;
        if (local_14 == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        return;
      }
LAB_0060d563:
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_BACKGROUND_STATIC",0x17);
    if (bVar1) {
      ParseLV4MeshFloatTriple(this,&(this->m_clrBackground).r);
    }
    else {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_AMBIENT_STATIC",0x14);
      if (bVar1) {
        ParseLV4MeshFloatTriple(this,&(this->m_clrAmbient).r);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_FIRSTFRAME",0x10);
        if (bVar1) {
          ParseLV4MeshLong(this,&this->iFirstFrame);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_LASTFRAME",0xf);
          if (bVar1) {
            ParseLV4MeshLong(this,&this->iLastFrame);
          }
          else {
            bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_FRAMESPEED",0x10);
            if (bVar1) {
              ParseLV4MeshLong(this,&this->iFrameSpeed);
            }
            else {
              bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE_TICKSPERFRAME",0x13);
              if (!bVar1) goto LAB_0060d563;
              ParseLV4MeshLong(this,&this->iTicksPerFrame);
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV1SceneBlock()
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"SCENE_BACKGROUND_STATIC",23))

            {
                // parse a color triple and assume it is really the bg color
                ParseLV4MeshFloatTriple( &m_clrBackground.r );
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_AMBIENT_STATIC",20))

            {
                // parse a color triple and assume it is really the bg color
                ParseLV4MeshFloatTriple( &m_clrAmbient.r );
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_FIRSTFRAME",16))
            {
                ParseLV4MeshLong(iFirstFrame);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_LASTFRAME",15))
            {
                ParseLV4MeshLong(iLastFrame);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_FRAMESPEED",16))
            {
                ParseLV4MeshLong(iFrameSpeed);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_TICKSPERFRAME",19))
            {
                ParseLV4MeshLong(iTicksPerFrame);
                continue;
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
}